

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream.h
# Opt level: O0

void fmt::v10::detail::write_buffer<char>
               (basic_ostream<char,_std::char_traits<char>_> *os,buffer<char> *buf)

{
  type tVar1;
  buffer<char> *in_RSI;
  char *in_RDI;
  unsigned_streamsize n;
  unsigned_streamsize max_size;
  unsigned_streamsize size;
  char *buf_data;
  type local_38;
  ulong local_20;
  char *local_18;
  
  local_18 = buffer<char>::data(in_RSI);
  local_20 = buffer<char>::size(in_RSI);
  max_value<long>();
  tVar1 = to_unsigned<long>(0x1547e9);
  do {
    local_38 = tVar1;
    if (local_20 <= tVar1) {
      local_38 = local_20;
    }
    std::ostream::write(in_RDI,(long)local_18);
    local_18 = local_18 + local_38;
    local_20 = local_20 - local_38;
  } while (local_20 != 0);
  return;
}

Assistant:

void write_buffer(std::basic_ostream<Char>& os, buffer<Char>& buf) {
  const Char* buf_data = buf.data();
  using unsigned_streamsize = std::make_unsigned<std::streamsize>::type;
  unsigned_streamsize size = buf.size();
  unsigned_streamsize max_size = to_unsigned(max_value<std::streamsize>());
  do {
    unsigned_streamsize n = size <= max_size ? size : max_size;
    os.write(buf_data, static_cast<std::streamsize>(n));
    buf_data += n;
    size -= n;
  } while (size != 0);
}